

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O3

Matrix4x4 * __thiscall
iDynTree::TransformDerivative::asHomogeneousTransformDerivative(TransformDerivative *this)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  Matrix4x4 *in_RDI;
  
  pdVar3 = in_RDI->m_data + 2;
  lVar4 = 0x28;
  do {
    pdVar1 = (double *)((long)(this->posDerivative).m_data + lVar4 + -0x10);
    dVar2 = pdVar1[1];
    ((Matrix4x4 *)(pdVar3 + -2))->m_data[0] = *pdVar1;
    pdVar3[-1] = dVar2;
    *pdVar3 = *(double *)((long)(this->posDerivative).m_data + lVar4);
    lVar4 = lVar4 + 0x18;
    pdVar3 = pdVar3 + 4;
  } while (lVar4 != 0x70);
  in_RDI->m_data[3] = (this->posDerivative).m_data[0];
  in_RDI->m_data[7] = (this->posDerivative).m_data[1];
  in_RDI->m_data[0xb] = (this->posDerivative).m_data[2];
  in_RDI->m_data[0xc] = 0.0;
  in_RDI->m_data[0xd] = 0.0;
  in_RDI->m_data[0xe] = 0.0;
  in_RDI->m_data[0xf] = 0.0;
  return in_RDI;
}

Assistant:

Matrix4x4 TransformDerivative::asHomogeneousTransformDerivative() const
{
    Matrix4x4 ret;

    Eigen::Map< Eigen::Matrix<double,4,4,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    retEigen.block<3,3>(0,0) = dR;
    retEigen.block<3,1>(0,3) = dp;
    retEigen.block<1,4>(3,0).setZero();

    return ret;
}